

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createAccessChain(Builder *this,StorageClass storageClass,Id base,Vector<Id> *offsets)

{
  Block *this_00;
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint member;
  Id IVar4;
  size_type sVar5;
  const_reference pvVar6;
  Instruction *pIVar7;
  size_t size;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_48;
  int local_40;
  int i_1;
  Instruction *local_30;
  Instruction *chain;
  int i;
  Id typeId;
  Vector<Id> *offsets_local;
  Id base_local;
  StorageClass storageClass_local;
  Builder *this_local;
  
  _i = offsets;
  offsets_local._0_4_ = base;
  offsets_local._4_4_ = storageClass;
  _base_local = this;
  chain._4_4_ = getTypeId(this,base);
  bVar2 = isPointerType(this,chain._4_4_);
  bVar3 = false;
  if (bVar2) {
    sVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size(_i);
    bVar3 = sVar5 != 0;
  }
  if (bVar3) {
    chain._4_4_ = getContainedTypeId(this,chain._4_4_);
    chain._0_4_ = 0;
    do {
      iVar1 = (int)chain;
      sVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size(_i);
      if ((int)sVar5 <= iVar1) {
        size = (size_t)offsets_local._4_4_;
        chain._4_4_ = makePointer(this,offsets_local._4_4_,chain._4_4_);
        pIVar7 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
        IVar4 = getUniqueId(this);
        Instruction::Instruction(pIVar7,IVar4,chain._4_4_,OpAccessChain);
        local_30 = pIVar7;
        Instruction::addIdOperand(pIVar7,(Id)offsets_local);
        for (local_40 = 0; iVar1 = local_40,
            sVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                              (_i), pIVar7 = local_30, iVar1 < (int)sVar5; local_40 = local_40 + 1)
        {
          pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                   operator[](_i,(long)local_40);
          Instruction::addIdOperand(pIVar7,*pvVar6);
        }
        this_00 = this->buildPoint;
        std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
        unique_ptr<std::default_delete<spv::Instruction>,void>
                  ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_48,
                   local_30);
        Block::addInstruction(this_00,&local_48);
        std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                  (&local_48);
        IVar4 = Instruction::getResultId(local_30);
        return IVar4;
      }
      bVar3 = isStructType(this,chain._4_4_);
      IVar4 = chain._4_4_;
      if (bVar3) {
        pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                 operator[](_i,(long)(int)chain);
        bVar3 = isConstantScalar(this,*pvVar6);
        IVar4 = chain._4_4_;
        if (!bVar3) {
          __assert_fail("isConstantScalar(offsets[i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                        ,0x509,
                        "Id spv::Builder::createAccessChain(StorageClass, Id, const dxil_spv::Vector<Id> &)"
                       );
        }
        pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                 operator[](_i,(long)(int)chain);
        member = getConstantScalar(this,*pvVar6);
        chain._4_4_ = getContainedTypeId(this,IVar4,member);
      }
      else {
        pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                 operator[](_i,(long)(int)chain);
        chain._4_4_ = getContainedTypeId(this,IVar4,*pvVar6);
      }
      chain._0_4_ = (int)chain + 1;
    } while( true );
  }
  __assert_fail("isPointerType(typeId) && offsets.size() > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x505,
                "Id spv::Builder::createAccessChain(StorageClass, Id, const dxil_spv::Vector<Id> &)"
               );
}

Assistant:

Id Builder::createAccessChain(StorageClass storageClass, Id base, const dxil_spv::Vector<Id>& offsets)
{
    // Figure out the final resulting type.
    spv::Id typeId = getTypeId(base);
    assert(isPointerType(typeId) && offsets.size() > 0);
    typeId = getContainedTypeId(typeId);
    for (int i = 0; i < (int)offsets.size(); ++i) {
        if (isStructType(typeId)) {
            assert(isConstantScalar(offsets[i]));
            typeId = getContainedTypeId(typeId, getConstantScalar(offsets[i]));
        } else
            typeId = getContainedTypeId(typeId, offsets[i]);
    }
    typeId = makePointer(storageClass, typeId);

    // Make the instruction
    Instruction* chain = new Instruction(getUniqueId(), typeId, OpAccessChain);
    chain->addIdOperand(base);
    for (int i = 0; i < (int)offsets.size(); ++i)
        chain->addIdOperand(offsets[i]);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(chain));

    return chain->getResultId();
}